

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError AlsaOpen(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *params,
                StreamDirection streamDir,snd_pcm_t **pcm)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pthread_t pVar4;
  long lVar5;
  undefined8 *in_RCX;
  int *in_RSI;
  PaUtilHostApiRepresentation *in_RDI;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  PaAlsaStreamInfo *streamInfo;
  PaAlsaDeviceInfo *deviceInfo;
  char *deviceName;
  int ret;
  PaError result;
  long in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  PaHostApiTypeId PVar6;
  int in_stack_ffffffffffffffbc;
  PaAlsaDeviceInfo *name;
  snd_pcm_t **pcmp;
  PaError local_24;
  
  PVar6 = (PaHostApiTypeId)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_24 = 0;
  name = (PaAlsaDeviceInfo *)0x0;
  lVar5 = *(long *)(in_RSI + 6);
  if (lVar5 == 0) {
    name = GetDeviceInfo(in_RDI,*in_RSI);
    pcmp = (snd_pcm_t **)name->alsaName;
  }
  else {
    pcmp = *(snd_pcm_t ***)(lVar5 + 0x18);
  }
  iVar1 = OpenPcm(pcmp,(char *)name,(snd_pcm_stream_t)((ulong)lVar5 >> 0x20),(int)lVar5,
                  in_stack_ffffffffffffffbc);
  if ((iVar1 < 0) && (*in_RCX = 0, iVar1 < 0)) {
    iVar3 = -0x2709;
    if (iVar1 == -0x10) {
      iVar3 = -0x2701;
    }
    if (iVar3 == -9999) {
      iVar3 = iVar1;
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        PVar6 = iVar3 >> 0x1f;
        (*alsa_snd_strerror)(iVar3);
        PaUtil_SetLastHostErrorInfo(PVar6,in_stack_ffffffffffffffa8,(char *)0x117e53);
      }
    }
    PaUtil_DebugPrint(
                     "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1735\n"
                     );
    local_24 = -0x2709;
    if (iVar1 == -0x10) {
      local_24 = -0x2701;
    }
  }
  else {
    iVar1 = (*(code *)alsa_snd_pcm_nonblock)(*in_RCX,0);
    if (iVar1 < 0) {
      pVar4 = pthread_self();
      iVar3 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar3 != 0) {
        lVar5 = (long)iVar1;
        (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(PVar6,lVar5,(char *)0x117f16);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_nonblock( *pcm, 0 )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1737\n"
                       );
      local_24 = -9999;
    }
  }
  return local_24;
}

Assistant:

static PaError AlsaOpen( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *params, StreamDirection
        streamDir, snd_pcm_t **pcm )
{
    PaError result = paNoError;
    int ret;
    const char* deviceName = "";
    const PaAlsaDeviceInfo *deviceInfo = NULL;
    PaAlsaStreamInfo *streamInfo = (PaAlsaStreamInfo *)params->hostApiSpecificStreamInfo;

    if( !streamInfo )
    {
        deviceInfo = GetDeviceInfo( hostApi, params->device );
        deviceName = deviceInfo->alsaName;
    }
    else
        deviceName = streamInfo->deviceString;

    PA_DEBUG(( "%s: Opening device %s\n", __FUNCTION__, deviceName ));
    if( (ret = OpenPcm( pcm, deviceName, streamDir == StreamDirection_In ? SND_PCM_STREAM_CAPTURE : SND_PCM_STREAM_PLAYBACK,
                    SND_PCM_NONBLOCK, 1 )) < 0 )
    {
        /* Not to be closed */
        *pcm = NULL;
        ENSURE_( ret, -EBUSY == ret ? paDeviceUnavailable : paBadIODeviceCombination );
    }
    ENSURE_( alsa_snd_pcm_nonblock( *pcm, 0 ), paUnanticipatedHostError );

end:
    return result;

error:
    goto end;
}